

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtree.h
# Opt level: O1

rtree_contents_t *
rtree_read(rtree_contents_t *__return_storage_ptr__,tsdn_t *tsdn,rtree_t *rtree,
          rtree_ctx_t *rtree_ctx,uintptr_t key)

{
  rtree_node_elm_t *prVar1;
  void *pvVar2;
  void *pvVar3;
  rtree_leaf_elm_t *prVar4;
  void *pvVar5;
  ulong uVar6;
  ulong uVar7;
  rtree_node_elm_t *prVar8;
  rtree_node_elm_t *prVar9;
  bool bVar10;
  
  pvVar5 = (void *)((ulong)rtree_ctx & 0xffffffffc0000000);
  uVar6 = (ulong)(((uint)((ulong)rtree_ctx >> 0x1e) & 0xf) << 4);
  prVar4 = (rtree_leaf_elm_t *)((long)&((rtree_t *)(rtree->root + -0xf))->base + uVar6);
  pvVar2 = *(void **)((long)&((rtree_t *)(rtree->root + -0xf))->base + uVar6);
  if (pvVar2 == pvVar5) {
    prVar4 = (rtree_leaf_elm_t *)
             ((ulong)((uint)((ulong)rtree_ctx >> 9) & 0x1ffff8) + (long)prVar4[1].le_bits.repr);
  }
  else if (rtree->root[0x11].child.repr == pvVar5) {
    pvVar3 = rtree->root[0x12].child.repr;
    rtree->root[0x11].child.repr = pvVar2;
    rtree->root[0x12].child.repr = prVar4[1].le_bits.repr;
    (prVar4->le_bits).repr = pvVar5;
    prVar4[1].le_bits.repr = pvVar3;
    prVar4 = (rtree_leaf_elm_t *)((ulong)((uint)rtree_ctx >> 9 & 0x1ffff8) + (long)pvVar3);
  }
  else {
    prVar8 = rtree->root + 0x13;
    if (rtree->root[0x13].child.repr == pvVar5) {
      uVar7 = 0;
      bVar10 = false;
    }
    else {
      uVar6 = 1;
      prVar9 = prVar8;
      do {
        uVar7 = uVar6;
        bVar10 = 6 < uVar7;
        if (uVar7 == 7) goto LAB_01dba3bd;
        prVar8 = prVar9 + 2;
        prVar1 = prVar9 + 2;
        uVar6 = uVar7 + 1;
        prVar9 = prVar8;
      } while ((prVar1->child).repr != pvVar5);
      bVar10 = 6 < uVar7;
    }
    pvVar3 = prVar8[1].child.repr;
    (prVar8->child).repr = rtree->root[uVar7 * 2 + 0x11].child.repr;
    prVar8[1].child.repr = rtree->root[uVar7 * 2 + 0x12].child.repr;
    rtree->root[uVar7 * 2 + 0x11].child.repr = pvVar2;
    rtree->root[uVar7 * 2 + 0x12].child.repr = prVar4[1].le_bits.repr;
    (prVar4->le_bits).repr = pvVar5;
    prVar4[1].le_bits.repr = pvVar3;
    prVar4 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)rtree_ctx >> 9) & 0x1ffff8) + (long)pvVar3);
LAB_01dba3bd:
    if (bVar10) {
      prVar4 = duckdb_je_rtree_leaf_elm_lookup_hard
                         (tsdn,&duckdb_je_arena_emap_global.rtree,(rtree_ctx_t *)rtree,
                          (uintptr_t)rtree_ctx,true,false);
    }
  }
  pvVar2 = (prVar4->le_bits).repr;
  (__return_storage_ptr__->metadata).szind = (uint)(ushort)((ulong)pvVar2 >> 0x30);
  (__return_storage_ptr__->metadata).slab = (_Bool)((byte)pvVar2 & 1);
  (__return_storage_ptr__->metadata).is_head =
       (_Bool)((byte)(((ulong)pvVar2 & 0xffffffff) >> 1) & 1);
  (__return_storage_ptr__->metadata).state =
       (extent_state_t)((ulong)pvVar2 >> 2) & (extent_state_transition|extent_state_retained);
  __return_storage_ptr__->edata = (edata_t *)(((long)pvVar2 << 0x10) >> 0x10 & 0xffffffffffffff80);
  return __return_storage_ptr__;
}

Assistant:

static inline rtree_contents_t
rtree_read(tsdn_t *tsdn, rtree_t *rtree, rtree_ctx_t *rtree_ctx,
    uintptr_t key) {
	rtree_leaf_elm_t *elm = rtree_leaf_elm_lookup(tsdn, rtree, rtree_ctx,
	    key, /* dependent */ true, /* init_missing */ false);
	assert(elm != NULL);
	return rtree_leaf_elm_read(tsdn, rtree, elm, /* dependent */ true);
}